

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::ModelProto::MergeFrom(ModelProto *this,ModelProto *from)

{
  uint uVar1;
  void *pvVar2;
  TrainerSpec *this_00;
  NormalizerSpec *pNVar3;
  SelfTestData *this_01;
  undefined1 *puVar4;
  
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
            (&(this->pieces_).super_RepeatedPtrFieldBase,&(from->pieces_).super_RepeatedPtrFieldBase
            );
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      this_00 = _internal_mutable_trainer_spec(this);
      puVar4 = (undefined1 *)from->trainer_spec_;
      if ((TrainerSpec *)puVar4 == (TrainerSpec *)0x0) {
        puVar4 = _TrainerSpec_default_instance_;
      }
      TrainerSpec::MergeFrom(this_00,(TrainerSpec *)puVar4);
    }
    if ((uVar1 & 2) != 0) {
      pNVar3 = _internal_mutable_normalizer_spec(this);
      puVar4 = (undefined1 *)from->normalizer_spec_;
      if ((NormalizerSpec *)puVar4 == (NormalizerSpec *)0x0) {
        puVar4 = _NormalizerSpec_default_instance_;
      }
      NormalizerSpec::MergeFrom(pNVar3,(NormalizerSpec *)puVar4);
    }
    if ((uVar1 & 4) != 0) {
      this_01 = _internal_mutable_self_test_data(this);
      puVar4 = (undefined1 *)from->self_test_data_;
      if ((SelfTestData *)puVar4 == (SelfTestData *)0x0) {
        puVar4 = _SelfTestData_default_instance_;
      }
      SelfTestData::MergeFrom(this_01,(SelfTestData *)puVar4);
    }
    if ((uVar1 & 8) != 0) {
      pNVar3 = _internal_mutable_denormalizer_spec(this);
      puVar4 = (undefined1 *)from->denormalizer_spec_;
      if ((NormalizerSpec *)puVar4 == (NormalizerSpec *)0x0) {
        puVar4 = _NormalizerSpec_default_instance_;
      }
      NormalizerSpec::MergeFrom(pNVar3,(NormalizerSpec *)puVar4);
      return;
    }
  }
  return;
}

Assistant:

void ModelProto::MergeFrom(const ModelProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.ModelProto)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pieces_.MergeFrom(from.pieces_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_mutable_trainer_spec()->::sentencepiece::TrainerSpec::MergeFrom(from._internal_trainer_spec());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_normalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_normalizer_spec());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_mutable_self_test_data()->::sentencepiece::SelfTestData::MergeFrom(from._internal_self_test_data());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_denormalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_denormalizer_spec());
    }
  }
}